

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O1

void search234_step(search234_state *state,int direction)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  pvVar1 = state->_node;
  if (pvVar1 == (void *)0x0) {
    state->element = (void *)0x0;
    iVar2 = 0;
  }
  else {
    iVar2 = state->_last;
    if (iVar2 != -1) {
      if (direction == 0) {
        __assert_fail("direction",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tree234.c"
                      ,0x27e,"void search234_step(search234_state *, int)");
      }
      if (direction < 1) {
        state->_hi = iVar2 + -1;
      }
      else {
        state->_lo = iVar2 + 1;
      }
      iVar2 = state->_lo;
      if (state->_hi < iVar2) {
        if (0 < iVar2) {
          iVar3 = state->_base;
          lVar4 = 0;
          do {
            iVar3 = iVar3 + *(int *)((long)pvVar1 + lVar4 * 4 + 0x28) + 1;
            state->_base = iVar3;
            lVar4 = lVar4 + 1;
          } while (iVar2 != lVar4);
        }
        pvVar1 = *(void **)((long)pvVar1 + (long)iVar2 * 8 + 8);
        state->_node = pvVar1;
        state->_last = -1;
      }
    }
    if (state->_last == -1) {
      state->_lo = 0;
      lVar4 = 0;
      iVar2 = 0;
      if (pvVar1 != (void *)0x0) {
        do {
          if (*(long *)((long)pvVar1 + lVar4 * 8 + 0x38) == 0) {
            iVar2 = (int)lVar4 + -1;
            goto LAB_0013a838;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        iVar2 = 2;
      }
LAB_0013a838:
      state->_hi = iVar2;
    }
    if (pvVar1 != (void *)0x0) {
      iVar3 = state->_hi + state->_lo;
      iVar2 = iVar3 / 2;
      state->_last = iVar2;
      state->element = *(void **)((long)pvVar1 + (long)iVar2 * 8 + 0x38);
      state->index = iVar2 + state->_base;
      if (iVar3 < -1) {
        return;
      }
      iVar3 = state->index;
      uVar5 = 0;
      do {
        iVar3 = iVar3 + *(int *)((long)pvVar1 + uVar5 * 4 + 0x28);
        state->index = iVar3;
        uVar5 = uVar5 + 1;
      } while (iVar2 + 1 != uVar5);
      return;
    }
    state->element = (void *)0x0;
    iVar2 = state->_base;
  }
  state->index = iVar2;
  return;
}

Assistant:

void search234_step(search234_state *state, int direction)
{
    node234 *node = state->_node;
    int i;

    if (!node) {
        state->element = NULL;
        state->index = 0;
        return;
    }

    if (state->_last != -1) {
        /*
         * We're already pointing at some element of a node, so we
         * should restrict to the elements left or right of it,
         * depending on the requested search direction.
         */
        assert(direction);
        assert(node);

        if (direction > 0)
            state->_lo = state->_last + 1;
        else
            state->_hi = state->_last - 1;

        if (state->_lo > state->_hi) {
            /*
             * We've run out of elements in this node, i.e. we've
             * narrowed to nothing but a child pointer. Descend to
             * that child, and update _base to the leftmost index of
             * its subtree.
             */
            for (i = 0; i < state->_lo; i++)
                state->_base += 1 + node->counts[i];
            state->_node = node = node->kids[state->_lo];
            state->_last = -1;
        }
    }

    if (state->_last == -1) {
        /*
         * We've just entered a new node - either because of the above
         * code, or because we were called from search234_start - and
         * anything in that node is a viable answer.
         */
        state->_lo = 0;
        state->_hi = node ? elements234(node)-1 : 0;
    }

    /*
     * Now we've got something we can return.
     */
    if (!node) {
        state->element = NULL;
        state->index = state->_base;
    } else {
        state->_last = (state->_lo + state->_hi) / 2;
        state->element = node->elems[state->_last];
        state->index = state->_base + state->_last;
        for (i = 0; i <= state->_last; i++)
            state->index += node->counts[i];
    }
}